

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaReaderIncrMergeInit(PmaReader *pReadr,int eMode)

{
  int iVar1;
  IncrMerger *pIncr_00;
  SortSubtask *pTask_00;
  sqlite3 *db_00;
  int mxSz;
  sqlite3 *db;
  SortSubtask *pTask;
  IncrMerger *pIncr;
  int rc;
  int eMode_local;
  PmaReader *pReadr_local;
  
  pIncr_00 = pReadr->pIncr;
  pTask_00 = pIncr_00->pTask;
  db_00 = pTask_00->pSorter->db;
  pIncr._0_4_ = vdbeMergeEngineInit(pTask_00,pIncr_00->pMerger,eMode);
  if ((int)pIncr == 0) {
    iVar1 = pIncr_00->mxSz;
    if (pIncr_00->bUseThread == 0) {
      if ((pTask_00->file2).pFd == (sqlite3_file *)0x0) {
        pIncr._0_4_ = vdbeSorterOpenTempFile(db_00,(pTask_00->file2).iEof,&(pTask_00->file2).pFd);
        (pTask_00->file2).iEof = 0;
      }
      if ((int)pIncr == 0) {
        pIncr_00->aFile[1].pFd = (pTask_00->file2).pFd;
        pIncr_00->iStartOff = (pTask_00->file2).iEof;
        (pTask_00->file2).iEof = (long)iVar1 + (pTask_00->file2).iEof;
      }
    }
    else {
      pIncr._0_4_ = vdbeSorterOpenTempFile(db_00,(long)iVar1,&pIncr_00->aFile[0].pFd);
      if ((int)pIncr == 0) {
        pIncr._0_4_ = vdbeSorterOpenTempFile(db_00,(long)iVar1,&pIncr_00->aFile[1].pFd);
      }
    }
  }
  if (((int)pIncr == 0) && (pIncr_00->bUseThread != 0)) {
    pIncr._0_4_ = vdbeIncrPopulate(pIncr_00);
  }
  if (((int)pIncr == 0) && (eMode != 1)) {
    pIncr._0_4_ = vdbePmaReaderNext(pReadr);
  }
  return (int)pIncr;
}

Assistant:

static int vdbePmaReaderIncrMergeInit(PmaReader *pReadr, int eMode){
  int rc = SQLITE_OK;
  IncrMerger *pIncr = pReadr->pIncr;
  SortSubtask *pTask = pIncr->pTask;
  sqlite3 *db = pTask->pSorter->db;

  /* eMode is always INCRINIT_NORMAL in single-threaded mode */
  assert( SQLITE_MAX_WORKER_THREADS>0 || eMode==INCRINIT_NORMAL );

  rc = vdbeMergeEngineInit(pTask, pIncr->pMerger, eMode);

  /* Set up the required files for pIncr. A multi-theaded IncrMerge object
  ** requires two temp files to itself, whereas a single-threaded object
  ** only requires a region of pTask->file2. */
  if( rc==SQLITE_OK ){
    int mxSz = pIncr->mxSz;
#if SQLITE_MAX_WORKER_THREADS>0
    if( pIncr->bUseThread ){
      rc = vdbeSorterOpenTempFile(db, mxSz, &pIncr->aFile[0].pFd);
      if( rc==SQLITE_OK ){
        rc = vdbeSorterOpenTempFile(db, mxSz, &pIncr->aFile[1].pFd);
      }
    }else
#endif
    /*if( !pIncr->bUseThread )*/{
      if( pTask->file2.pFd==0 ){
        assert( pTask->file2.iEof>0 );
        rc = vdbeSorterOpenTempFile(db, pTask->file2.iEof, &pTask->file2.pFd);
        pTask->file2.iEof = 0;
      }
      if( rc==SQLITE_OK ){
        pIncr->aFile[1].pFd = pTask->file2.pFd;
        pIncr->iStartOff = pTask->file2.iEof;
        pTask->file2.iEof += mxSz;
      }
    }
  }

#if SQLITE_MAX_WORKER_THREADS>0
  if( rc==SQLITE_OK && pIncr->bUseThread ){
    /* Use the current thread to populate aFile[1], even though this
    ** PmaReader is multi-threaded. If this is an INCRINIT_TASK object,
    ** then this function is already running in background thread 
    ** pIncr->pTask->thread. 
    **
    ** If this is the INCRINIT_ROOT object, then it is running in the 
    ** main VDBE thread. But that is Ok, as that thread cannot return
    ** control to the VDBE or proceed with anything useful until the 
    ** first results are ready from this merger object anyway.
    */
    assert( eMode==INCRINIT_ROOT || eMode==INCRINIT_TASK );
    rc = vdbeIncrPopulate(pIncr);
  }
#endif

  if( rc==SQLITE_OK && (SQLITE_MAX_WORKER_THREADS==0 || eMode!=INCRINIT_TASK) ){
    rc = vdbePmaReaderNext(pReadr);
  }

  return rc;
}